

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
::
castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
           *this,HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                 *other,round_direction round_dir)

{
  ushort uVar1;
  ushort uVar2;
  uint_type uVar3;
  int iVar4;
  short sVar5;
  uint uVar6;
  short sVar7;
  bool bVar8;
  
  (other->value_).data_ = 0;
  uVar1 = *(ushort *)this;
  if ((uVar1 & 0x7fff) == 0) {
    if ((short)uVar1 < 0) {
      (other->value_).data_ = 0x80000000;
    }
  }
  else {
    uVar3 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
            ::getNormalizedSignificand
                      ((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                        *)this);
    uVar2 = *(ushort *)this;
    if ((uVar2 >> 10 & 0x1f) == 0) {
      sVar5 = -0xf;
      uVar6 = 0x200;
      do {
        if ((uVar6 & uVar1 & 0x3ff) != 0) goto LAB_005482e9;
        sVar5 = sVar5 + -1;
        bVar8 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar8);
      sVar5 = -0x18;
    }
    else {
      sVar5 = (uVar2 >> 10 & 0x1f) - 0xf;
    }
LAB_005482e9:
    sVar7 = (short)(uVar1 & 0x3ff);
    if (sVar7 == 0 || (uVar2 & 0x7c00) != 0x7c00) {
      if (((uVar2 & 0x7c00) != 0x7c00 || sVar7 != 0) && (sVar5 < 0x80)) {
        HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
        ::setFromSignUnbiasedExponentAndNormalizedSignificand
                  (other,SUB21(uVar1 >> 0xf,0),(int)sVar5,(uint)uVar3 << 0xd,
                   (uVar2 >> 0xf | kToPositiveInfinity) == round_dir);
        return;
      }
      iVar4 = (uint)(-1 < (short)uVar1) * -0x80000000;
    }
    else {
      iVar4 = (uint)(-1 < (short)uVar1) * -0x80000000 +
              (uint)(ushort)(uVar1 * 0x2000 + (ushort)((ushort)(uVar1 * 0x2000) == 0));
    }
    (other->value_).data_ = iVar4 - 0x800000;
  }
  return;
}

Assistant:

void castTo(other_T& other, round_direction round_dir) {
    other = other_T(static_cast<typename other_T::native_type>(0));
    bool negate = isNegative();
    if (getUnsignedBits() == 0) {
      if (negate) {
        other.set_value(-other.value());
      }
      return;
    }
    uint_type significand = getSignificandBits();
    bool carried = false;
    typename other_T::uint_type rounded_significand =
        getRoundedNormalizedSignificand<other_T>(round_dir, &carried);

    int_type exponent = getUnbiasedExponent();
    if (exponent == min_exponent) {
      // If we are denormal, normalize the exponent, so that we can encode
      // easily.
      exponent = static_cast<int_type>(exponent + 1);
      for (uint_type check_bit = first_exponent_bit >> 1; check_bit != 0;
           check_bit = static_cast<uint_type>(check_bit >> 1)) {
        exponent = static_cast<int_type>(exponent - 1);
        if (check_bit & significand) break;
      }
    }

    bool is_nan =
        (getBits() & exponent_mask) == exponent_mask && significand != 0;
    bool is_inf =
        !is_nan &&
        ((exponent + carried) > static_cast<int_type>(other_T::exponent_bias) ||
         (significand == 0 && (getBits() & exponent_mask) == exponent_mask));

    // If we are Nan or Inf we should pass that through.
    if (is_inf) {
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask)));
      return;
    }
    if (is_nan) {
      typename other_T::uint_type shifted_significand;
      shifted_significand = static_cast<typename other_T::uint_type>(
          negatable_left_shift<
              static_cast<int_type>(other_T::num_fraction_bits) -
              static_cast<int_type>(num_fraction_bits)>::val(significand));

      // We are some sort of Nan. We try to keep the bit-pattern of the Nan
      // as close as possible. If we had to shift off bits so we are 0, then we
      // just set the last bit.
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask |
              (shifted_significand == 0 ? 0x1 : shifted_significand))));
      return;
    }

    bool round_underflow_up =
        isNegative() ? round_dir == round_direction::kToNegativeInfinity
                     : round_dir == round_direction::kToPositiveInfinity;
    using other_int_type = typename other_T::int_type;
    // setFromSignUnbiasedExponentAndNormalizedSignificand will
    // zero out any underflowing value (but retain the sign).
    other.setFromSignUnbiasedExponentAndNormalizedSignificand(
        negate, static_cast<other_int_type>(exponent), rounded_significand,
        round_underflow_up);
    return;
  }